

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limits.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::constantIndexExpressionCheck(TParseContext *this,TIntermNode *index)

{
  undefined1 local_78 [8];
  TIndexTraverser it;
  TIntermNode *index_local;
  TParseContext *this_local;
  
  it.badLoc._16_8_ = index;
  TIndexTraverser::TIndexTraverser((TIndexTraverser *)local_78,&this->inductiveLoopIds);
  (**(code **)(*(long *)it.badLoc._16_8_ + 0x10))(it.badLoc._16_8_,local_78);
  if (((byte)it.inductiveLoopIds & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,&it.bad,"Non-constant-index-expression","limitations","");
  }
  TIndexTraverser::~TIndexTraverser((TIndexTraverser *)local_78);
  return;
}

Assistant:

void TParseContext::constantIndexExpressionCheck(TIntermNode* index)
{
    TIndexTraverser it(inductiveLoopIds);

    index->traverse(&it);

    if (it.bad)
        error(it.badLoc, "Non-constant-index-expression", "limitations", "");
}